

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fence.cpp
# Opt level: O0

void __thiscall
myvk::FenceGroup::Initialize
          (FenceGroup *this,
          vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
          *fences)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  VkDevice pVVar3;
  undefined8 in_RSI;
  vector<VkFence_T_*,_std::allocator<VkFence_T_*>_> *in_RDI;
  shared_ptr<myvk::Fence> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *__range1;
  pointer *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::shared_ptr<myvk::Fence>_*,_std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>_>
  local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::clear
            ((vector<VkFence_T_*,_std::allocator<VkFence_T_*>_> *)0x2c98e1);
  std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>::front
            ((vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *
             )in_RDI);
  peVar2 = std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x2c98f3);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2c9904);
  pVVar3 = Device::GetHandle(this_00);
  (((_Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *)
   &in_RDI->super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>)->_M_impl).
  super__Vector_impl_data._M_start = (pointer)pVVar3;
  local_18 = local_10;
  local_20._M_current =
       (shared_ptr<myvk::Fence> *)
       std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>::
       begin((vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *
             )in_stack_ffffffffffffffb8);
  std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>::end
            ((vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *
             )in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::shared_ptr<myvk::Fence>_*,_std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<myvk::Fence>_*,_std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::shared_ptr<myvk::Fence>_*,_std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<myvk::Fence>_*,_std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>_>
    ::operator*(&local_20);
    in_stack_ffffffffffffffb8 =
         &(((_Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
             *)&in_RDI->super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>)->_M_impl).
          super__Vector_impl_data._M_finish;
    peVar2 = std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2c997f);
    Fence::GetHandle(peVar2);
    std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<myvk::Fence>_*,_std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void FenceGroup::Initialize(const std::vector<Ptr<Fence>> &fences) {
	m_fences.clear();
	m_device = fences.front()->GetDevicePtr()->GetHandle();
	for (const auto &i : fences)
		m_fences.push_back(i->GetHandle());
}